

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomStamp.cpp
# Opt level: O0

bool __thiscall
OpenMD::AtomStamp::setOrientation(AtomStamp *this,vector<double,_std::allocator<double>_> *ort)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  double *pdVar4;
  ostream *poVar5;
  OpenMDException *this_00;
  string *msg;
  undefined8 uVar6;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  ostringstream oss;
  bool ret;
  string local_1c0 [48];
  ostringstream local_190 [264];
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  
  sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  if (sVar2 == 3) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    vVar1 = *pvVar3;
    pdVar4 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0xd0),0);
    *pdVar4 = vVar1;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,1);
    vVar1 = *pvVar3;
    pdVar4 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0xd0),1);
    *pdVar4 = vVar1;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,2);
    vVar1 = *pvVar3;
    pdVar4 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 0xd0),2);
    *pdVar4 = vVar1;
    *(undefined1 *)(in_RDI + 0xf1) = 1;
    return false;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar5 = std::operator<<((ostream *)local_190,"orientation");
  containerToString<std::vector<double,std::allocator<double>>>(in_stack_ffffffffffffff78);
  this_00 = (OpenMDException *)std::operator<<(poVar5,local_1c0);
  msg = (string *)std::operator<<((ostream *)this_00," is invalid");
  std::ostream::operator<<(msg,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1c0);
  uVar6 = __cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  OpenMDException::OpenMDException(this_00,msg);
  __cxa_throw(uVar6,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

bool AtomStamp::setOrientation(const std::vector<RealType>& ort) {
    bool ret = false;
    if (ort.size() == 3) {
      orientation_[0] = ort[0];
      orientation_[1] = ort[1];
      orientation_[2] = ort[2];
      haveOrt_        = true;
    } else {
      std::ostringstream oss;
      oss << "orientation" << containerToString(ort) << " is invalid"
          << std::endl;
      throw OpenMDException(oss.str());
    }

    return ret;
  }